

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerHLSL::emit_sampled_image_op
          (CompilerHLSL *this,uint32_t result_type,uint32_t result_id,uint32_t image_id,
          uint32_t samp_id)

{
  uint32_t local_4c;
  uint32_t local_48;
  uint32_t local_44;
  string local_40;
  
  local_4c = samp_id;
  local_48 = image_id;
  local_44 = result_type;
  if (((this->hlsl_options).shader_model < 0x28) ||
     ((this->super_CompilerGLSL).super_Compiler.combined_image_samplers.
      super_VectorView<spirv_cross::CombinedImageSampler>.buffer_size != 0)) {
    CompilerGLSL::to_combined_image_sampler_abi_cxx11_
              (&local_40,&this->super_CompilerGLSL,(VariableID)image_id,(VariableID)samp_id);
    CompilerGLSL::emit_op(&this->super_CompilerGLSL,result_type,result_id,&local_40,true,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  else {
    Compiler::set<spirv_cross::SPIRCombinedImageSampler,unsigned_int&,unsigned_int&,unsigned_int&>
              ((Compiler *)this,result_id,&local_44,&local_48,&local_4c);
  }
  return;
}

Assistant:

void CompilerHLSL::emit_sampled_image_op(uint32_t result_type, uint32_t result_id, uint32_t image_id, uint32_t samp_id)
{
	if (hlsl_options.shader_model >= 40 && combined_image_samplers.empty())
	{
		set<SPIRCombinedImageSampler>(result_id, result_type, image_id, samp_id);
	}
	else
	{
		// Make sure to suppress usage tracking. It is illegal to create temporaries of opaque types.
		emit_op(result_type, result_id, to_combined_image_sampler(image_id, samp_id), true, true);
	}
}